

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.cpp
# Opt level: O2

void __thiscall Block::Block(Block *this,uint32_t bIndexIn,string *bDataIn,string *merkroot)

{
  time_t tVar1;
  
  (this->bPrevHash)._M_dataplus._M_p = (pointer)&(this->bPrevHash).field_2;
  (this->bPrevHash)._M_string_length = 0;
  (this->bPrevHash).field_2._M_local_buf[0] = '\0';
  (this->_bHash)._M_dataplus._M_p = (pointer)&(this->_bHash).field_2;
  (this->_bHash)._M_string_length = 0;
  (this->_bHash).field_2._M_local_buf[0] = '\0';
  (this->merkle_root)._M_dataplus._M_p = (pointer)&(this->merkle_root).field_2;
  (this->merkle_root)._M_string_length = 0;
  (this->merkle_root).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->_bData,(string *)bDataIn);
  this->_bIndex = bIndexIn;
  std::__cxx11::string::_M_assign((string *)&this->merkle_root);
  this->_bNonce = -1;
  tVar1 = time((time_t *)0x0);
  this->_cTime = tVar1;
  return;
}

Assistant:

Block::Block(uint32_t bIndexIn,const string & bDataIn, string merkroot):_bIndex(bIndexIn),_bData(bDataIn){
    merkle_root = merkroot;
	_bNonce = -1;
	_cTime = time(nullptr);
}